

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::SetupBackgroundSweep
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  bVar2 = AllocatorsAreEmpty(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x657,"(this->AllocatorsAreEmpty())","this->AllocatorsAreEmpty()");
    if (!bVar2) goto LAB_006466f7;
    *puVar4 = 0;
  }
  RecyclerSweep::
  SaveNextAllocableBlockHead<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep,this);
  uVar3 = HeapBucket::GetMediumBucketIndex(&this->super_HeapBucket);
  if ((recyclerSweep->mediumFinalizableWithBarrierData).bucketData[uVar3].pendingSweepList !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x65a,"(recyclerSweep.GetPendingSweepBlockList(this) == nullptr)",
                       "recyclerSweep.GetPendingSweepBlockList(this) == nullptr");
    if (!bVar2) {
LAB_006466f7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  StopAllocationBeforeSweep(this);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::SetupBackgroundSweep(RecyclerSweep& recyclerSweep)
{
    // Don't allocate from existing block temporary when concurrent sweeping

    // Currently Rescan clear allocators, if we remove the uncollectedAllocBytes there, we can
    // avoid it there and do it here.
    Assert(this->AllocatorsAreEmpty());

    DebugOnly(recyclerSweep.SaveNextAllocableBlockHead(this));
    Assert(recyclerSweep.GetPendingSweepBlockList(this) == nullptr);

    this->StopAllocationBeforeSweep();
}